

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendSignalEvent
          (ze_command_list_handle_t hCommandList,ze_event_handle_t hEvent)

{
  ze_pfnCommandListAppendSignalEvent_t pfnAppendSignalEvent;
  ze_result_t result;
  ze_event_handle_t hEvent_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendSignalEvent._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c3d8 != (code *)0x0) {
    pfnAppendSignalEvent._4_4_ = (*DAT_0011c3d8)(hCommandList,hEvent);
  }
  return pfnAppendSignalEvent._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendSignalEvent(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_event_handle_t hEvent                        ///< [in] handle of the event
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendSignalEvent = context.zeDdiTable.CommandList.pfnAppendSignalEvent;
        if( nullptr != pfnAppendSignalEvent )
        {
            result = pfnAppendSignalEvent( hCommandList, hEvent );
        }
        else
        {
            // generic implementation
        }

        return result;
    }